

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void addJsonObject(QJsonObject *object,QString *keyPrefix,ProValueMap *map)

{
  bool bVar1;
  QString *in_RDX;
  QStringBuilder<const_QString_&,_QLatin1String> *in_RSI;
  long in_FS_OFFSET;
  QString key;
  const_iterator end;
  const_iterator it;
  QStringList keys;
  QStringBuilder<const_QString_&,_const_QString_&> *in_stack_fffffffffffffed8;
  QList<QString> *in_stack_fffffffffffffee0;
  QString *a;
  QJsonObject *in_stack_fffffffffffffee8;
  QLatin1String *in_stack_fffffffffffffef0;
  ProValueMap *map_00;
  Data *in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff20;
  QJsonValue *in_stack_ffffffffffffff28;
  ProValueMap local_c0;
  qsizetype in_stack_ffffffffffffff48;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_48;
  undefined8 local_40;
  QStringList local_38;
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x2c6f41);
  QJsonObject::size();
  QList<QString>::reserve((QList<QString> *)in_RSI,in_stack_ffffffffffffff48);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_48 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)0xaaaaaaaaaaaaaaaa;
  _local_48 = (QJsonValueConstRef)QJsonObject::begin(in_stack_fffffffffffffee8);
  QJsonObject::end(in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = operator!=((const_iterator *)in_stack_fffffffffffffee0,
                       (const_iterator *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    QJsonObject::const_iterator::key((const_iterator *)in_stack_fffffffffffffed8);
    QList<QString>::append(in_stack_fffffffffffffee0,(parameter_type)in_stack_fffffffffffffed8);
    QJsonObject::const_iterator::value((const_iterator *)in_stack_fffffffffffffee8);
    QJsonValueConstRef::operator_cast_to_QJsonValue((QJsonValueConstRef *)in_stack_fffffffffffffee0)
    ;
    operator+((QString *)in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
    QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffed8);
    addJsonValue(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (ProValueMap *)in_stack_ffffffffffffff18);
    QString::~QString((QString *)0x2c70d0);
    QJsonValue::~QJsonValue(local_20);
    QString::~QString((QString *)0x2c70ea);
    QJsonObject::const_iterator::operator++((const_iterator *)&local_48);
  }
  a = (QString *)&stack0xffffffffffffff18;
  QLatin1String::QLatin1String(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  operator+(a,(QLatin1String *)in_RSI);
  map_00 = &local_c0;
  QStringBuilder::operator_cast_to_QString(in_RSI);
  insertJsonKeyValue(in_RDX,&local_38,map_00);
  QString::~QString((QString *)0x2c716d);
  QList<QString>::~QList((QList<QString> *)0x2c7177);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonObject(const QJsonObject &object, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    keys.reserve(object.size());
    for (auto it = object.begin(), end = object.end(); it != end; ++it) {
        const QString key = it.key();
        keys.append(key);
        addJsonValue(it.value(), keyPrefix + key, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}